

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

bool SQClosure::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *ret)

{
  SQSharedState *ss;
  SQObjectValue func_00;
  bool bVar1;
  SQWeakRef *root;
  SQClosure *x;
  SQObjectPtr func;
  
  bVar1 = CheckTag(v,read,up,0x53514952);
  if ((((bVar1) && (bVar1 = CheckTag(v,read,up,1), bVar1)) && (bVar1 = CheckTag(v,read,up,8), bVar1)
      ) && (bVar1 = CheckTag(v,read,up,4), bVar1)) {
    func.super_SQObject._type = OT_NULL;
    func.super_SQObject._unVal.pTable = (SQTable *)0x0;
    bVar1 = SQFunctionProto::Load(v,up,read,&func);
    if ((bVar1) &&
       (bVar1 = CheckTag(v,read,up,0x5441494c), func_00 = func.super_SQObject._unVal, bVar1)) {
      ss = v->_sharedstate;
      root = SQRefCounted::GetWeakRef((v->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
      x = Create(ss,func_00.pFunctionProto,root);
      bVar1 = true;
      SQObjectPtr::operator=(ret,x);
    }
    else {
      bVar1 = false;
    }
    SQObjectPtr::~SQObjectPtr(&func);
    return bVar1;
  }
  return false;
}

Assistant:

bool SQClosure::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &ret)
{
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_HEAD));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQChar)));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQInteger)));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQFloat)));
    SQObjectPtr func;
    _CHECK_IO(SQFunctionProto::Load(v,up,read,func));
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_TAIL));
    ret = SQClosure::Create(_ss(v),_funcproto(func),_table(v->_roottable)->GetWeakRef(OT_TABLE));
    //FIXME: load an root for this closure
    return true;
}